

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadU8(BinaryReader *this,uint8_t *out_value,char *desc)

{
  Result RVar1;
  char *desc_local;
  uint8_t *out_value_local;
  BinaryReader *this_local;
  
  RVar1 = ReadT<unsigned_char>(this,out_value,"uint8_t",desc);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReader::ReadU8(uint8_t* out_value, const char* desc) {
  return ReadT(out_value, "uint8_t", desc);
}